

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomColor::read(DomColor *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  QStringBuilder<QLatin1String,_const_QStringView_&> *str;
  long in_FS_OFFSET;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde1;
  byte in_stack_fffffffffffffde2;
  undefined1 in_stack_fffffffffffffde3;
  undefined4 in_stack_fffffffffffffde4;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  byte in_stack_fffffffffffffdf7;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  QXmlStreamAttribute *in_stack_fffffffffffffe08;
  undefined1 local_190 [64];
  undefined1 local_150 [64];
  undefined1 local_110 [64];
  undefined1 local_d0 [16];
  QLatin1StringView local_c0;
  QStringView local_80;
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  str = (QStringBuilder<QLatin1String,_const_QStringView_&> *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)
                           CONCAT44(in_stack_fffffffffffffde4,
                                    CONCAT13(in_stack_fffffffffffffde3,
                                             CONCAT12(in_stack_fffffffffffffde2,
                                                      CONCAT11(in_stack_fffffffffffffde1,
                                                               in_stack_fffffffffffffde0)))));
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)
                        CONCAT44(in_stack_fffffffffffffde4,
                                 CONCAT13(in_stack_fffffffffffffde3,
                                          CONCAT12(in_stack_fffffffffffffde2,
                                                   CONCAT11(in_stack_fffffffffffffde1,
                                                            in_stack_fffffffffffffde0)))));
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    in_stack_fffffffffffffe08 = QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1b2450);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)this,CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (QString *)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdf7 =
         ::operator==((QStringView *)
                      CONCAT44(in_stack_fffffffffffffde4,
                               CONCAT13(in_stack_fffffffffffffde3,
                                        CONCAT12(in_stack_fffffffffffffde2,
                                                 CONCAT11(in_stack_fffffffffffffde1,
                                                          in_stack_fffffffffffffde0)))),
                      (QStringView *)in_stack_fffffffffffffdd8);
    QString::~QString((QString *)0x1b24b4);
    if ((in_stack_fffffffffffffdf7 & 1) == 0) {
      in_stack_fffffffffffffde8 = str;
      local_c0 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)str,
                            CONCAT44(in_stack_fffffffffffffde4,
                                     CONCAT13(in_stack_fffffffffffffde3,
                                              CONCAT12(in_stack_fffffffffffffde2,
                                                       CONCAT11(in_stack_fffffffffffffde1,
                                                                in_stack_fffffffffffffde0)))));
      ::operator+((QLatin1String *)
                  CONCAT44(in_stack_fffffffffffffde4,
                           CONCAT13(in_stack_fffffffffffffde3,
                                    CONCAT12(in_stack_fffffffffffffde2,
                                             CONCAT11(in_stack_fffffffffffffde1,
                                                      in_stack_fffffffffffffde0)))),
                  (QStringView *)in_stack_fffffffffffffdd8);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffdd8);
      QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffde8);
      QString::~QString((QString *)0x1b2578);
    }
    else {
      local_80 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b24c8);
      iVar3 = QStringView::toInt((QStringView *)in_stack_fffffffffffffde8,
                                 (bool *)CONCAT44(in_stack_fffffffffffffde4,
                                                  CONCAT13(in_stack_fffffffffffffde3,
                                                           CONCAT12(in_stack_fffffffffffffde2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0)))),
                                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      setAttributeAlpha(this,iVar3);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b2596);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001b28b0;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      local_d0._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_d0._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_d0 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)this,CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (QString *)in_stack_fffffffffffffde8);
      other.m_size._4_4_ = in_stack_fffffffffffffe04;
      other.m_size._0_4_ = in_stack_fffffffffffffe00;
      other.m_data = (storage_type_conflict *)in_stack_fffffffffffffe08;
      iVar4 = QStringView::compare((QStringView *)in_stack_fffffffffffffdd8,other,CaseInsensitive);
      bVar2 = iVar4 != 0 ^ 0xff;
      QString::~QString((QString *)0x1b2668);
      if ((bVar2 & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)this,CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                   (QString *)in_stack_fffffffffffffde8);
        other_00.m_size._4_4_ = in_stack_fffffffffffffe04;
        other_00.m_size._0_4_ = in_stack_fffffffffffffe00;
        other_00.m_data = (storage_type_conflict *)in_stack_fffffffffffffe08;
        iVar4 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffdd8,other_00,CaseInsensitive);
        in_stack_fffffffffffffde2 = iVar4 != 0 ^ 0xff;
        QString::~QString((QString *)0x1b2720);
        if ((in_stack_fffffffffffffde2 & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)this,CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0))
          ;
          QStringView::QStringView<QString,_true>
                    ((QStringView *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                     (QString *)in_stack_fffffffffffffde8);
          other_01.m_size._4_4_ = in_stack_fffffffffffffe04;
          other_01.m_size._0_4_ = in_stack_fffffffffffffe00;
          other_01.m_data = (storage_type_conflict *)in_stack_fffffffffffffe08;
          iVar4 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffdd8,other_01,CaseInsensitive);
          in_stack_fffffffffffffde1 = iVar4 != 0 ^ 0xff;
          QString::~QString((QString *)0x1b27d8);
          if ((in_stack_fffffffffffffde1 & 1) == 0) {
            in_stack_fffffffffffffdd8 = str;
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffde8,
                       CONCAT44(iVar3,CONCAT13(bVar2,CONCAT12(in_stack_fffffffffffffde2,
                                                              CONCAT11(in_stack_fffffffffffffde1,
                                                                       in_stack_fffffffffffffde0))))
                      );
            ::operator+((QLatin1String *)
                        CONCAT44(iVar3,CONCAT13(bVar2,CONCAT12(in_stack_fffffffffffffde2,
                                                               CONCAT11(in_stack_fffffffffffffde1,
                                                                        in_stack_fffffffffffffde0)))
                                ),(QStringView *)in_stack_fffffffffffffdd8);
            ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffdd8);
            QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffdd8);
            QString::~QString((QString *)0x1b2895);
          }
          else {
            QXmlStreamReader::readElementText(local_190,str,0);
            iVar3 = QString::toInt((QString *)in_stack_fffffffffffffde8,
                                   (bool *)CONCAT44(iVar3,CONCAT13(bVar2,CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0)))),
                                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
            setElementBlue(this,iVar3);
            QString::~QString((QString *)0x1b2825);
          }
        }
        else {
          QXmlStreamReader::readElementText(local_150,str,0);
          iVar3 = QString::toInt((QString *)in_stack_fffffffffffffde8,
                                 (bool *)CONCAT44(iVar3,CONCAT13(bVar2,CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0)))),
                                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          setElementGreen(this,iVar3);
          QString::~QString((QString *)0x1b276d);
        }
      }
      else {
        QXmlStreamReader::readElementText(local_110,str,0);
        iVar3 = QString::toInt((QString *)in_stack_fffffffffffffde8,
                               (bool *)CONCAT44(iVar3,CONCAT13(bVar2,CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0)))),
                               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        setElementRed(this,iVar3);
        QString::~QString((QString *)0x1b26b5);
      }
    }
  } while (iVar3 != 5);
LAB_001b28b0:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1b28bd);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColor::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"alpha"_s) {
            setAttributeAlpha(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"red"_s, Qt::CaseInsensitive)) {
                setElementRed(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"green"_s, Qt::CaseInsensitive)) {
                setElementGreen(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"blue"_s, Qt::CaseInsensitive)) {
                setElementBlue(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}